

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

Parser * __thiscall cli::Parser::no_default_abi_cxx11_(Parser *this)

{
  Parser *in_RSI;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  Parser *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"No default parameter has been specified.\n");
  std::operator<<(local_190,"The given argument must be used with a parameter.\n");
  print_help(in_RSI,(stringstream *)local_1a0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string no_default() const {
			std::stringstream ss { };
			ss << "No default parameter has been specified.\n";
			ss << "The given argument must be used with a parameter.\n";
			print_help(ss);
			return ss.str();
		}